

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.cpp
# Opt level: O3

int si9ma::Trie::prefix_search(TrieNode *root,string *str)

{
  size_type sVar1;
  TrieNode *cur;
  
  if (str->_M_string_length != 0) {
    sVar1 = 0;
    do {
      root = *(TrieNode **)((long)root + (long)(str->_M_dataplus)._M_p[sVar1] * 8 + -0x300);
      if (root == (TrieNode *)0x0) {
        return 0;
      }
      sVar1 = sVar1 + 1;
    } while (str->_M_string_length != sVar1);
  }
  return root->pass;
}

Assistant:

int Trie::prefix_search(TrieNode *root,const string &str) {
        auto *cur = root;

        for (int i = 0; i < str.length(); ++i) {
            int index = str[i] - 'a';

            if (cur->nexts[index] == nullptr)
                return 0;

            cur = cur->nexts[index];
        }

        return cur->pass;
    }